

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

char * __thiscall CServerBrowser::GetFavoritePassword(CServerBrowser *this,char *pAddress)

{
  int iVar1;
  CFavoriteServer *pCVar2;
  CServerBrowserFavorites *in_RSI;
  NETADDR *in_RDI;
  long in_FS_OFFSET;
  CFavoriteServer *pFavorite;
  NETADDR Addr;
  char *in_stack_ffffffffffffffb0;
  NETADDR *in_stack_ffffffffffffffc0;
  char *local_28;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_20,0,0x18);
  iVar1 = net_addr_from_str(in_RDI,in_stack_ffffffffffffffb0);
  if (iVar1 == 0) {
    pCVar2 = CServerBrowserFavorites::FindFavoriteByAddr
                       (in_RSI,in_stack_ffffffffffffffc0,(int *)in_RDI);
    if (pCVar2 == (CFavoriteServer *)0x0) {
      local_28 = (char *)0x0;
    }
    else if (pCVar2->m_aPassword[0] == '\0') {
      local_28 = (char *)0x0;
    }
    else {
      local_28 = pCVar2->m_aPassword;
    }
  }
  else {
    local_28 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

const char *CServerBrowser::GetFavoritePassword(const char *pAddress)
{
	NETADDR Addr = {0};
	if(net_addr_from_str(&Addr, pAddress))
		return 0;
	CServerBrowserFavorites::CFavoriteServer *pFavorite = m_ServerBrowserFavorites.FindFavoriteByAddr(Addr, 0);
	if(!pFavorite)
		return 0;
	if(!pFavorite->m_aPassword[0])
		return 0;
	return pFavorite->m_aPassword;
}